

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  bool bVar1;
  _Self __tmp;
  Type *pTVar2;
  mapped_type *pmVar3;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  Type *pTVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  ArrayFeatureType *pAVar7;
  LogMessage *pLVar8;
  ImageFeatureType *pIVar9;
  int64 *piVar10;
  undefined7 in_register_00000009;
  size_t val;
  int iVar11;
  int iVar12;
  FeatureType *pFVar13;
  bool bVar14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  LogFinisher local_141;
  ModelDescription *local_140;
  undefined4 local_134;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_130;
  _Rb_tree_node_base *local_128;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_120;
  _Base_ptr local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_134 = (undefined4)CONCAT71(in_register_00000009,useInputAndOutputConstraints);
  this->numColors = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  local_120 = &this->blobColors;
  local_128 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_128;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_128;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_130 = &this->blobShapes;
  local_118 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_118;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_118;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110.level_ = LOGLEVEL_INFO;
  local_140 = interface;
  if (0 < (interface->input_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->input_).super_RepeatedPtrFieldBase,local_110.level_);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](local_130,(pTVar2->name_).ptr_);
      ShapeConstraint::setName(pmVar3,(pTVar2->name_).ptr_);
      this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[](local_120,(pTVar2->name_).ptr_);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(this_00,(int *)&local_110);
      if ((char)local_134 != '\0') {
        pFVar13 = pTVar2->type_;
        if (pFVar13 == (FeatureType *)0x0) {
          pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        ShapeConstraint::updateConstraint(pmVar3,pFVar13);
      }
      local_110.level_ = local_110.level_ + LOGLEVEL_WARNING;
    } while ((int)local_110.level_ < (local_140->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)&local_110,&local_120->_M_t);
    iVar12 = (layers->super_RepeatedPtrFieldBase).current_size_;
    if (0 < iVar12) {
      iVar11 = 0;
      do {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                           (&layers->super_RepeatedPtrFieldBase,iVar11);
        PassColorsDown(this,pTVar4);
        ProcessLayer(this,pTVar4);
        iVar11 = iVar11 + 1;
        iVar12 = (layers->super_RepeatedPtrFieldBase).current_size_;
      } while (iVar11 < iVar12);
    }
    while (0 < iVar12) {
      iVar12 = iVar12 + -1;
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar12);
      PassColorsUp(this,pTVar4);
      ProcessLayer(this,pTVar4);
    }
    p_Var5 = (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar14 = p_Var5 == local_128;
    if (!bVar14) {
      iVar12 = this->numColors;
      if (iVar12 == *(int *)&p_Var5[3]._M_parent) {
        do {
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          bVar14 = p_Var5 == local_128;
          if (bVar14) break;
        } while (iVar12 == *(int *)&p_Var5[3]._M_parent);
      }
      else {
        bVar14 = false;
      }
    }
    if (local_110.message_.field_2._M_allocated_capacity ==
        (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      bVar1 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )local_110.message_._M_dataplus._M_p,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          )&local_110.filename_,
                         (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
    }
    else {
      bVar1 = false;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 *)&local_110);
  } while (!bVar14 && bVar1 == false);
  if (((char)local_134 != '\0') &&
     (0 < (local_140->output_).super_RepeatedPtrFieldBase.current_size_)) {
    local_128 = (_Rb_tree_node_base *)&local_140->output_;
    iVar12 = 0;
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_128,iVar12);
      iVar11 = std::__cxx11::string::compare((string *)(pTVar2->name_).ptr_);
      if (((iVar11 != 0) &&
          (iVar11 = std::__cxx11::string::compare((string *)(pTVar2->name_).ptr_), iVar11 != 0)) &&
         (iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                  ::find(&local_130->_M_t,(pTVar2->name_).ptr_), iVar6._M_node != local_118)) {
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                 ::at(local_130,(pTVar2->name_).ptr_);
        pFVar13 = pTVar2->type_;
        if (pFVar13 == (FeatureType *)0x0) {
          pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if (pFVar13->_oneof_case_[0] == 5) {
          pAVar7 = (ArrayFeatureType *)(pFVar13->Type_).int64type_;
LAB_00285e4e:
          pFVar13 = pTVar2->type_;
          if (pFVar13 == (FeatureType *)0x0) {
            pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if ((pAVar7->shape_).current_size_ == 3) {
            if (pFVar13->_oneof_case_[0] == 5) {
              pAVar7 = (pFVar13->Type_).multiarraytype_;
            }
            else {
              pAVar7 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar7->shape_).current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_d8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_d8,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_141,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
            }
            ShapeConstraint::setChannel(pmVar3,((pAVar7->shape_).rep_)->elements[0]);
            pFVar13 = pTVar2->type_;
            if (pFVar13 == (FeatureType *)0x0) {
              pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar13->_oneof_case_[0] == 5) {
              pAVar7 = (pFVar13->Type_).multiarraytype_;
            }
            else {
              pAVar7 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar7->shape_).current_size_ < 2) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_a0,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_141,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
            }
            ShapeConstraint::setHeight(pmVar3,(size_t)(pAVar7->shape_).rep_[1].arena);
            pFVar13 = pTVar2->type_;
            if (pFVar13 == (FeatureType *)0x0) {
              pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar13->_oneof_case_[0] == 5) {
              pAVar7 = (pFVar13->Type_).multiarraytype_;
            }
            else {
              pAVar7 = Specification::ArrayFeatureType::default_instance();
            }
            if ((pAVar7->shape_).current_size_ < 3) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                         ,0x476);
              pLVar8 = google::protobuf::internal::LogMessage::operator<<
                                 (&local_68,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=(&local_141,pLVar8);
              google::protobuf::internal::LogMessage::~LogMessage(&local_68);
            }
            piVar10 = (pAVar7->shape_).rep_[1].elements;
            goto LAB_0028605d;
          }
          if (pFVar13->_oneof_case_[0] == 5) {
            pAVar7 = (ArrayFeatureType *)(pFVar13->Type_).int64type_;
          }
          else {
            pAVar7 = Specification::ArrayFeatureType::default_instance();
          }
          if ((pAVar7->shape_).current_size_ != 1) goto LAB_002860e6;
          pFVar13 = pTVar2->type_;
          if (pFVar13 == (FeatureType *)0x0) {
            pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar13->_oneof_case_[0] == 5) {
            pAVar7 = (pFVar13->Type_).multiarraytype_;
          }
          else {
            pAVar7 = Specification::ArrayFeatureType::default_instance();
          }
          if ((pAVar7->shape_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar8 = google::protobuf::internal::LogMessage::operator<<
                               (&local_110,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=(&local_141,pLVar8);
            google::protobuf::internal::LogMessage::~LogMessage(&local_110);
          }
          ShapeConstraint::setChannel(pmVar3,((pAVar7->shape_).rep_)->elements[0]);
          val = 1;
          ShapeConstraint::setHeight(pmVar3,1);
        }
        else {
          if (pFVar13->_oneof_case_[0] != 4) {
            pAVar7 = Specification::ArrayFeatureType::default_instance();
            goto LAB_00285e4e;
          }
          ShapeConstraint::setChannel
                    (pmVar3,(ulong)(((pFVar13->Type_).imagetype_)->colorspace_ != 10) * 2 + 1);
          pFVar13 = pTVar2->type_;
          if (pFVar13 == (FeatureType *)0x0) {
            pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar13->_oneof_case_[0] == 4) {
            pIVar9 = (pFVar13->Type_).imagetype_;
          }
          else {
            pIVar9 = Specification::ImageFeatureType::default_instance();
          }
          ShapeConstraint::setHeight(pmVar3,pIVar9->height_);
          pFVar13 = pTVar2->type_;
          if (pFVar13 == (FeatureType *)0x0) {
            pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
          }
          if (pFVar13->_oneof_case_[0] == 4) {
            pIVar9 = (pFVar13->Type_).imagetype_;
          }
          else {
            pIVar9 = Specification::ImageFeatureType::default_instance();
          }
          piVar10 = &pIVar9->width_;
LAB_0028605d:
          val = *piVar10;
        }
        ShapeConstraint::setWidth(pmVar3,val);
      }
LAB_002860e6:
      iVar12 = iVar12 + 1;
    } while (iVar12 < (local_140->output_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                if (desc.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}